

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void lowbd_generate_hog(uint8_t *src,int stride,int rows,int cols,float *hist)

{
  int iVar1;
  int dy_00;
  int iVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int in_ECX;
  int iVar7;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float *in_R8;
  int idx;
  int temp;
  int dy;
  int dx;
  uint8_t *right;
  uint8_t *left;
  uint8_t *below;
  uint8_t *above;
  int c;
  int r;
  float total;
  int local_2c;
  int local_28;
  float local_24;
  long local_8;
  
  local_24 = 0.1;
  local_8 = in_RDI + in_ESI;
  for (local_28 = 1; local_28 < in_EDX + -1; local_28 = local_28 + 1) {
    for (local_2c = 1; local_2c < in_ECX + -1; local_2c = local_2c + 1) {
      pbVar3 = (byte *)(local_8 + (local_2c - in_ESI));
      pbVar4 = (byte *)(local_8 + (local_2c + in_ESI));
      pbVar5 = (byte *)(local_8 + (local_2c + -1));
      pbVar6 = (byte *)(local_8 + (local_2c + 1));
      iVar1 = ((uint)pbVar6[-in_ESI] + (uint)*pbVar6 * 2 + (uint)pbVar6[in_ESI]) -
              ((uint)pbVar5[-in_ESI] + (uint)*pbVar5 * 2 + (uint)pbVar5[in_ESI]);
      dy_00 = ((uint)pbVar4[-1] + (uint)*pbVar4 * 2 + (uint)pbVar4[1]) -
              ((uint)pbVar3[-1] + (uint)*pbVar3 * 2 + (uint)pbVar3[1]);
      if ((iVar1 != 0) || (dy_00 != 0)) {
        iVar2 = iVar1;
        if (iVar1 < 1) {
          iVar2 = -iVar1;
        }
        iVar7 = dy_00;
        if (dy_00 < 1) {
          iVar7 = -dy_00;
        }
        iVar2 = iVar2 + iVar7;
        if (iVar2 != 0) {
          local_24 = (float)iVar2 + local_24;
          if (iVar1 == 0) {
            *in_R8 = (float)(iVar2 / 2) + *in_R8;
            in_R8[0x1f] = (float)(iVar2 / 2) + in_R8[0x1f];
          }
          else {
            iVar1 = get_hist_bin_idx(iVar1,dy_00);
            in_R8[iVar1] = (float)iVar2 + in_R8[iVar1];
          }
        }
      }
    }
    local_8 = local_8 + in_ESI;
  }
  normalize_hog(local_24,in_R8);
  return;
}

Assistant:

static inline void lowbd_generate_hog(const uint8_t *src, int stride, int rows,
                                      int cols, float *hist) {
  float total = 0.1f;
  src += stride;
  for (int r = 1; r < rows - 1; ++r) {
    for (int c = 1; c < cols - 1; ++c) {
      const uint8_t *above = &src[c - stride];
      const uint8_t *below = &src[c + stride];
      const uint8_t *left = &src[c - 1];
      const uint8_t *right = &src[c + 1];
      // Calculate gradient using Sobel filters.
      const int dx = (right[-stride] + 2 * right[0] + right[stride]) -
                     (left[-stride] + 2 * left[0] + left[stride]);
      const int dy = (below[-1] + 2 * below[0] + below[1]) -
                     (above[-1] + 2 * above[0] + above[1]);
      if (dx == 0 && dy == 0) continue;
      const int temp = abs(dx) + abs(dy);
      if (!temp) continue;
      total += temp;
      if (dx == 0) {
        hist[0] += temp / 2;
        hist[BINS - 1] += temp / 2;
      } else {
        const int idx = get_hist_bin_idx(dx, dy);
        assert(idx >= 0 && idx < BINS);
        hist[idx] += temp;
      }
    }
    src += stride;
  }

  normalize_hog(total, hist);
}